

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::Clara::Detail::invokeLambda<int,Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
          (ParserResult *__return_storage_ptr__,Detail *this,
          anon_class_8_1_50637480_for_m_lambda *lambda,string *arg)

{
  bool bVar1;
  undefined1 local_58 [8];
  ParserResult result;
  int temp;
  string *arg_local;
  anon_class_8_1_50637480_for_m_lambda *lambda_local;
  
  result.m_errorMessage.field_2._12_4_ = 0;
  convertInto<int>((ParserResult *)local_58,(string *)lambda,
                   (int *)(result.m_errorMessage.field_2._M_local_buf + 0xc));
  bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)local_58);
  if (bVar1) {
    LambdaInvoker<void>::invoke<Catch::makeCommandLineParser(Catch::ConfigData&)::__2,int>
              (__return_storage_ptr__,(LambdaInvoker<void> *)this,
               (anon_class_8_1_50637480_for_m_lambda *)((long)&result.m_errorMessage.field_2 + 0xc),
               (int *)arg);
  }
  else {
    BasicResult<Catch::Clara::ParseResultType>::BasicResult
              (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_58);
  }
  BasicResult<Catch::Clara::ParseResultType>::~BasicResult
            ((BasicResult<Catch::Clara::ParseResultType> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

auto invokeLambda( L const& lambda, std::string const& arg )
                -> ParserResult {
                ArgType temp{};
                auto result = convertInto( arg, temp );
                return !result ? result
                               : LambdaInvoker<typename UnaryLambdaTraits<
                                     L>::ReturnType>::invoke( lambda, temp );
            }